

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogDefault.cpp
# Opt level: O0

bool Rml::LogDefault::LogMessage(Type param_1,String *message)

{
  FILE *__stream;
  undefined8 uVar1;
  String *message_local;
  Type param_0_local;
  
  __stream = _stderr;
  uVar1 = ::std::__cxx11::string::c_str();
  fprintf(__stream,"%s\n",uVar1);
  return true;
}

Assistant:

bool LogDefault::LogMessage(Log::Type /*type*/, const String& message)
{
	#ifdef RMLUI_PLATFORM_EMSCRIPTEN
	puts(message.c_str());
	#else
	fprintf(stderr, "%s\n", message.c_str());
	#endif
	return true;
}